

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

double __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel(ImageAdapter<unsigned_char> *this,float x,float y,int c)

{
  pointer pIVar1;
  uint uVar2;
  work_t wVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar7 = (double)this->image->img[c][(long)y][(long)x];
  }
  else {
    dVar7 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar2 = (int)(dVar7 / 0.6931471805599453) - 1;
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) >> 3) *
            -0x49249249 - 1;
    if ((int)uVar2 < (int)uVar5) {
      uVar5 = uVar2;
    }
    uVar2 = uVar5 + 1;
    iVar6 = 1 << ((byte)uVar2 & 0x1f);
    if ((int)uVar5 < 0) {
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this->image,x,y,c);
      dVar7 = (double)wVar3;
      if (uVar5 != 0xffffffff) {
        return dVar7;
      }
    }
    else {
      fVar9 = (float)iVar6;
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar1 + uVar5,x / fVar9,y / fVar9,c);
      dVar7 = (double)wVar3;
    }
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) >> 3);
    if ((SBORROW4(uVar2,iVar4 * -0x49249249) != (int)(uVar2 + iVar4 * 0x49249249) < 0) &&
       (dVar8 = (double)iVar6, dVar8 = (1.0 / (this->super_ImageAdapterBase).scale - dVar8) / dVar8,
       1e-06 < dVar8)) {
      fVar9 = (float)(2 << ((byte)uVar2 & 0x1f));
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar1 + uVar2,x / fVar9,y / fVar9,c);
      dVar7 = (1.0 - dVar8) * dVar7 + (double)wVar3 * dVar8;
    }
  }
  return dVar7;
}

Assistant:

double getPixel(float x, float y, int c) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);
        double ret;

        if (j < 0)
        {
          ret=image->getBilinear(x, y, c);
        }
        else
        {
          ret=mipmap[j].getBilinear(x/ds, y/ds, c);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            ret=(1-f)*ret+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), c);
          }
        }

        return ret;
      }

      return image->get(static_cast<long>(x), static_cast<long>(y), c);
    }